

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lgc.c
# Opt level: O1

int runafewfinalizers(lua_State *L)

{
  global_State *pgVar1;
  uint uVar2;
  uint uVar3;
  bool bVar4;
  
  pgVar1 = L->l_G;
  bVar4 = pgVar1->tobefnz == (GCObject *)0x0;
  if (bVar4) {
    uVar2 = 0;
  }
  else {
    uVar2 = 0;
    if (pgVar1->gcfinnum != 0) {
      uVar3 = 0;
      uVar2 = 0;
      do {
        GCTM(L,1);
        uVar2 = uVar2 + 1;
        bVar4 = pgVar1->tobefnz == (GCObject *)0x0;
        if (bVar4) goto LAB_0010bfa2;
      } while (uVar2 < pgVar1->gcfinnum);
    }
    if (!bVar4) {
      uVar3 = pgVar1->gcfinnum * 2;
      goto LAB_0010bfa2;
    }
  }
  uVar3 = 0;
LAB_0010bfa2:
  pgVar1->gcfinnum = uVar3;
  return uVar2;
}

Assistant:

static int runafewfinalizers (lua_State *L) {
  global_State *g = G(L);
  unsigned int i;
  lua_assert(!g->tobefnz || g->gcfinnum > 0);
  for (i = 0; g->tobefnz && i < g->gcfinnum; i++)
    GCTM(L, 1);  /* call one finalizer */
  g->gcfinnum = (!g->tobefnz) ? 0  /* nothing more to finalize? */
                    : g->gcfinnum * 2;  /* else call a few more next time */
  return i;
}